

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

uint __thiscall llvm::ARM::parseFPU(ARM *this,StringRef FPU)

{
  bool bVar1;
  StringRef SVar2;
  StringRef SVar3;
  char *local_100;
  char *local_f8;
  undefined1 local_e0 [8];
  anon_struct_32_6_383d471d F;
  anon_struct_32_6_383d471d *__end1;
  anon_struct_32_6_383d471d *__begin1;
  anon_struct_32_6_383d471d (*__range1) [22];
  char *local_98;
  StringRef Syn;
  StringRef FPU_local;
  char *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  SVar2.Length = (size_t)FPU.Data;
  SVar2.Data = (char *)this;
  SVar2 = getFPUSynonym(SVar2);
  __end1 = (anon_struct_32_6_383d471d *)&(anonymous_namespace)::FPUNames;
  F._24_8_ = (anonymous_namespace)::ARCHExtNames;
  while( true ) {
    if (__end1 == (anon_struct_32_6_383d471d *)F._24_8_) {
      return 0;
    }
    local_e0 = (undefined1  [8])__end1->NameCStr;
    F.NameCStr = (char *)__end1->NameLength;
    F.NameLength._0_4_ = __end1->ID;
    F.NameLength._4_4_ = __end1->FPUVersion;
    F.ID = __end1->NeonSupport;
    F.FPUVersion = __end1->Restriction;
    local_98 = SVar2.Data;
    Syn.Data = (char *)SVar2.Length;
    SVar3 = anon_unknown.dwarf_3181bb::anon_struct_32_6_383d471d::getName
                      ((anon_struct_32_6_383d471d *)local_e0);
    local_100 = SVar3.Data;
    local_f8 = (char *)SVar3.Length;
    local_50 = local_98;
    local_48 = Syn.Data;
    local_38 = local_100;
    local_30 = local_f8;
    local_40 = &local_50;
    bVar1 = false;
    if (Syn.Data == local_f8) {
      local_18 = local_98;
      local_20 = local_100;
      local_28 = local_f8;
      if (local_f8 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_98,local_100,(size_t)local_f8);
      }
      bVar1 = local_c == 0;
    }
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  return (uint)F.NameLength;
}

Assistant:

unsigned llvm::ARM::parseFPU(StringRef FPU) {
  StringRef Syn = getFPUSynonym(FPU);
  for (const auto F : FPUNames) {
    if (Syn == F.getName())
      return F.ID;
  }
  return ARM::FK_INVALID;
}